

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O0

xmlNodePtr xmlRelaxNGSkipIgnored(xmlRelaxNGValidCtxtPtr ctxt,xmlNodePtr node)

{
  int iVar1;
  bool bVar2;
  xmlNodePtr local_18;
  xmlNodePtr node_local;
  xmlRelaxNGValidCtxtPtr ctxt_local;
  
  local_18 = node;
  while( true ) {
    bVar2 = false;
    if ((((local_18 != (xmlNodePtr)0x0) && (bVar2 = true, local_18->type != XML_COMMENT_NODE)) &&
        (bVar2 = true, local_18->type != XML_PI_NODE)) &&
       ((((bVar2 = true, local_18->type != XML_XINCLUDE_START &&
          (bVar2 = true, local_18->type != XML_XINCLUDE_END)) &&
         ((local_18->type == XML_TEXT_NODE ||
          (bVar2 = false, local_18->type == XML_CDATA_SECTION_NODE)))) &&
        (bVar2 = true, (ctxt->flags & 4U) == 0)))) {
      iVar1 = xmlRelaxNGIsBlank(local_18->content);
      bVar2 = iVar1 != 0;
    }
    if (!bVar2) break;
    local_18 = local_18->next;
  }
  return local_18;
}

Assistant:

static xmlNodePtr
xmlRelaxNGSkipIgnored(xmlRelaxNGValidCtxtPtr ctxt ATTRIBUTE_UNUSED,
                      xmlNodePtr node)
{
    /*
     * TODO complete and handle entities
     */
    while ((node != NULL) &&
           ((node->type == XML_COMMENT_NODE) ||
            (node->type == XML_PI_NODE) ||
	    (node->type == XML_XINCLUDE_START) ||
	    (node->type == XML_XINCLUDE_END) ||
            (((node->type == XML_TEXT_NODE) ||
              (node->type == XML_CDATA_SECTION_NODE)) &&
             ((ctxt->flags & FLAGS_MIXED_CONTENT) ||
              (IS_BLANK_NODE(node)))))) {
        node = node->next;
    }
    return (node);
}